

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightHandle __thiscall
pbrt::LightHandle::Create
          (LightHandle *this,string *name,ParameterDictionary *parameters,Transform *renderFromLight
          ,CameraTransform *cameraTransform,MediumHandle *outsideMedium,FileLoc *loc,Allocator alloc
          )

{
  long lVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  uintptr_t iptr_1;
  UniformInfiniteLight *p;
  PointLight *pPVar8;
  GoniometricLight *pGVar9;
  ProjectionLight *pPVar10;
  DistantLight *pDVar11;
  RGBColorSpace *pRVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  undefined4 extraout_var;
  ImageInfiniteLight *p_00;
  undefined4 extraout_var_01;
  Transform *loc_00;
  long lVar14;
  iterator __begin10;
  DenselySampledSpectrum *pDVar15;
  pointer p_01;
  ulong uVar16;
  char *pcVar17;
  CameraTransform *loc_01;
  size_t *psVar18;
  long lVar19;
  Float FVar20;
  Float FVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [56];
  float fVar25;
  float fVar26;
  Vector3f VVar27;
  Point3f PVar28;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Float local_39c;
  Allocator alloc_local;
  float local_38c;
  RGBColorSpace *colorSpace;
  Float local_370;
  float local_36c;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> portal;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> L;
  string filename;
  ImageChannelDesc channelDesc;
  Image image;
  SpectrumHandle local_208;
  ColorEncodingHandle local_200;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_1f8;
  SpectrumHandle local_1f0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1e8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1e0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1d8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1d0;
  ImageAndMetadata imageAndMetadata;
  undefined4 extraout_var_00;
  
  (this->
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ).bits = 0;
  alloc_local = alloc;
  loc_00 = renderFromLight;
  loc_01 = cameraTransform;
  iVar7 = std::__cxx11::string::compare((char *)name);
  if (iVar7 == 0) {
    local_1d0.bits =
         (outsideMedium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pPVar8 = PointLight::Create(renderFromLight,(MediumHandle *)&local_1d0,parameters,
                                parameters->colorSpace,(FileLoc *)loc_01,alloc);
    uVar16 = (ulong)pPVar8 | 0x1000000000000;
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = uVar16;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)name);
    if (iVar7 == 0) {
      local_1d8.bits =
           (outsideMedium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pPVar10 = (ProjectionLight *)
                SpotLight::Create(renderFromLight,(MediumHandle *)&local_1d8,parameters,
                                  parameters->colorSpace,(FileLoc *)loc_01,alloc);
      uVar16 = 0x5000000000000;
LAB_00355c3d:
      uVar16 = uVar16 | (ulong)pPVar10;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)name);
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare((char *)name);
        if (iVar7 == 0) {
          local_1e8.bits =
               (outsideMedium->
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               ).bits;
          pPVar10 = ProjectionLight::Create
                              (renderFromLight,(MediumHandle *)&local_1e8,parameters,loc,alloc);
          uVar16 = 0x3000000000000;
          goto LAB_00355c3d;
        }
        iVar7 = std::__cxx11::string::compare((char *)name);
        if (iVar7 == 0) {
          pDVar11 = DistantLight::Create
                              (renderFromLight,parameters,parameters->colorSpace,(FileLoc *)loc_00,
                               alloc);
          uVar16 = (ulong)pDVar11 | 0x2000000000000;
          goto LAB_00355c40;
        }
        iVar7 = std::__cxx11::string::compare((char *)name);
        if (iVar7 != 0) {
          pcVar17 = "%s: light type unknown.";
          goto LAB_00356210;
        }
        pRVar12 = parameters->colorSpace;
        pvVar13 = &imageAndMetadata.image.channelNames;
        imageAndMetadata.image._0_8_ = pvVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"L","");
        ParameterDictionary::GetSpectrumArray
                  (&L,parameters,(string *)&imageAndMetadata,Illuminant,alloc_local);
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pvVar13) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        imageAndMetadata.image._0_8_ = pvVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"scale","");
        local_39c = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,1.0);
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pvVar13) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        imageAndMetadata.image._0_8_ = pvVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"portal","");
        ParameterDictionary::GetPoint3fArray(&portal,parameters,(string *)&imageAndMetadata);
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pvVar13) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        image._0_8_ = &image.channelNames;
        std::__cxx11::string::_M_construct<char_const*>((string *)&image,"filename","");
        paVar2 = &channelDesc.offset.field_2;
        channelDesc.offset.alloc.memoryResource = (memory_resource *)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc,"");
        ParameterDictionary::GetOneString
                  ((string *)&imageAndMetadata,parameters,(string *)&image,(string *)&channelDesc);
        ResolveFilename(&filename,(string *)&imageAndMetadata);
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pvVar13) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
             *)channelDesc.offset.alloc.memoryResource != paVar2) {
          operator_delete(channelDesc.offset.alloc.memoryResource,
                          channelDesc.offset.field_2._0_8_ + 1);
        }
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)image._0_8_ != &image.channelNames) {
          operator_delete((void *)image._0_8_,
                          (ulong)((long)&(image.channelNames.alloc.memoryResource)->
                                         _vptr_memory_resource + 1));
        }
        imageAndMetadata.image._0_8_ = pvVar13;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&imageAndMetadata,"illuminance","");
        FVar20 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,-1.0);
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pvVar13) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (filename._M_string_length == 0) {
            pDVar15 = &pRVar12->illuminant;
            local_1f0.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                     )((ulong)pDVar15 | 0x2000000000000);
            FVar21 = SpectrumToPhotometric(&local_1f0);
            uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)FVar20),1);
            bVar6 = (bool)((byte)uVar5 & 1);
            local_39c = (Float)((uint)bVar6 * (int)((FVar20 / 3.1415927) * (local_39c / FVar21)) +
                               (uint)!bVar6 * (int)(local_39c / FVar21));
            imageAndMetadata.image._0_8_ = pDVar15;
            iVar7 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                              (alloc_local.memoryResource,0xd8,8);
            p = (UniformInfiniteLight *)CONCAT44(extraout_var,iVar7);
            pstd::pmr::polymorphic_allocator<std::byte>::
            construct<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&alloc_local,p,renderFromLight,(DenselySampledSpectrum **)&imageAndMetadata,
                       &local_39c,&alloc_local);
            goto LAB_00355b59;
          }
          local_200.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          Image::Read(&imageAndMetadata,&filename,alloc_local,&local_200);
          colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
          image._0_8_ = &image.channelNames;
          std::__cxx11::string::_M_construct<char_const*>((string *)&image,"R","");
          image.channelNames.nAlloc = (size_t)&image.encoding;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&image.channelNames.nAlloc,"G","");
          psVar18 = &image.p8.nStored;
          image.p8.ptr = (uchar *)psVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&image.p8.ptr,"B","");
          requestedChannels.n = 3;
          requestedChannels.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          Image::GetChannelDesc(&channelDesc,&imageAndMetadata.image,requestedChannels);
          lVar19 = -0x60;
          do {
            if (psVar18 != (size_t *)psVar18[-2]) {
              operator_delete((long *)psVar18[-2],*psVar18 + 1);
            }
            psVar18 = psVar18 + -4;
            lVar19 = lVar19 + 0x20;
          } while (lVar19 != 0);
          if (channelDesc.offset.nStored == 0) {
            ErrorExit<std::__cxx11::string&>
                      (loc,
                       "%s: image provided to \"infinite\" light must have R, G, and B channels.",
                       &filename);
          }
          local_208.
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                   )((ulong)&colorSpace->illuminant | 0x2000000000000);
          FVar21 = SpectrumToPhotometric(&local_208);
          local_39c = local_39c / FVar21;
          auVar23 = ZEXT864(0);
          uVar5 = imageAndMetadata.image._0_8_;
          if (0.0 < FVar20) {
            pRVar12 = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
            iVar7 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
            uVar5 = imageAndMetadata.image._0_8_;
            if (imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y < 1) {
              local_38c = 0.0;
            }
            else {
              auVar3 = *(undefined1 (*) [16])((pRVar12->XYZFromRGB).m + 1);
              local_370 = (pRVar12->XYZFromRGB).m[1][2];
              lVar19 = 0;
              auVar4 = vmovshdup_avx(auVar3);
              local_38c = 0.0;
              do {
                if (0 < imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x) {
                  fVar25 = (float)iVar7;
                  uVar16 = 0;
                  do {
                    auVar22._0_4_ =
                         ((float)(int)uVar16 + 0.5) /
                         (float)imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
                    auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    auVar22 = vinsertps_avx(auVar22,ZEXT416((uint)(((float)(int)lVar19 + 0.5) /
                                                                  fVar25)),0x10);
                    imageAndMetadata.image._0_8_ = uVar5;
                    VVar27 = EqualAreaSquareToSphere((Point2f)auVar22._0_8_);
                    uVar5 = imageAndMetadata.image._0_8_;
                    if (0.0 < VVar27.super_Tuple3<pbrt::Vector3,_float>.z) {
                      local_36c = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
                      Image::GetChannels((ImageChannelValues *)&image,&imageAndMetadata.image,
                                         (Point2i)(lVar19 << 0x20 | uVar16),(WrapMode2D)0x200000002)
                      ;
                      auVar23 = ZEXT464((uint)local_38c);
                      pvVar13 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)image._8_8_;
                      if (image._8_8_ == 0) {
                        pvVar13 = &image.channelNames;
                      }
                      lVar14 = 0;
                      do {
                        fVar26 = auVar3._0_4_;
                        if (((int)lVar14 != 0) && (fVar26 = auVar4._0_4_, (int)lVar14 != 1)) {
                          fVar26 = local_370;
                        }
                        lVar1 = lVar14 * 4;
                        lVar14 = lVar14 + 1;
                        auVar22 = vfmadd213ss_fma(ZEXT416((uint)(fVar26 * *(float *)((long)&(pvVar13
                                                  ->alloc).memoryResource + lVar1))),
                                                  ZEXT416((uint)local_36c),auVar23._0_16_);
                        auVar23 = ZEXT1664(auVar22);
                      } while (lVar14 != 3);
                      local_38c = auVar22._0_4_;
                      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                      *)&image);
                      uVar5 = imageAndMetadata.image._0_8_;
                    }
                    imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x =
                         SUB84(uVar5,4);
                    uVar16 = uVar16 + 1;
                    iVar7 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
                  } while ((long)uVar16 <
                           (long)imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x
                          );
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 < iVar7);
            }
            local_39c = (FVar20 / ((6.2831855 /
                                   (float)(imageAndMetadata.image.resolution.
                                           super_Tuple2<pbrt::Point2,_int>.x * iVar7)) * local_38c))
                        * local_39c;
            auVar23 = ZEXT464((uint)local_39c);
          }
          imageAndMetadata.image._0_8_ = uVar5;
          Image::SelectChannels(&image,&imageAndMetadata.image,&channelDesc,alloc_local);
          p_01 = portal.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            iVar7 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                              (alloc_local.memoryResource,0x250,8);
            p_00 = (ImageInfiniteLight *)CONCAT44(extraout_var_01,iVar7);
            pstd::pmr::polymorphic_allocator<std::byte>::
            construct<pbrt::ImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&alloc_local,p_00,renderFromLight,&image,&colorSpace,&local_39c,&filename,
                       &alloc_local);
            uVar16 = 0x8000000000000;
          }
          else {
            do {
              auVar24 = auVar23._8_56_;
              PVar28 = CameraTransform::RenderFromWorld(cameraTransform,p_01);
              auVar23._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
              auVar23._8_56_ = auVar24;
              uVar5 = vmovlps_avx(auVar23._0_16_);
              (p_01->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar5;
              (p_01->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar5 >> 0x20);
              (p_01->super_Tuple3<pbrt::Point3,_float>).z =
                   PVar28.super_Tuple3<pbrt::Point3,_float>.z;
              p_01 = p_01 + 1;
            } while (p_01 != portal.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
            iVar7 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                              (alloc_local.memoryResource,0x208,8);
            p_00 = (ImageInfiniteLight *)CONCAT44(extraout_var_00,iVar7);
            pstd::pmr::polymorphic_allocator<std::byte>::
            construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&alloc_local,(PortalImageInfiniteLight *)p_00,renderFromLight,&image,
                       &colorSpace,&local_39c,&filename,&portal,&alloc_local);
            uVar16 = 0x9000000000000;
          }
          uVar16 = (ulong)p_00 | uVar16;
          (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits = uVar16;
          Image::~Image(&image);
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    (&channelDesc.offset);
          ImageAndMetadata::~ImageAndMetadata(&imageAndMetadata);
        }
        else {
          if (filename._M_string_length != 0) {
            pcVar17 = "Can\'t specify both emission \"L\" and \"filename\" with ImageInfiniteLight";
LAB_00356249:
            ErrorExit(loc,pcVar17);
          }
          if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pcVar17 = "Portals are not supported for infinite lights without \"filename\".";
            goto LAB_00356249;
          }
          local_1f8.bits =
               ((L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start)->
               super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               ).bits;
          FVar21 = SpectrumToPhotometric((SpectrumHandle *)&local_1f8);
          uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)FVar20),1);
          bVar6 = (bool)((byte)uVar5 & 1);
          local_39c = (Float)((uint)bVar6 * (int)((FVar20 / 3.1415927) * (local_39c / FVar21)) +
                             (uint)!bVar6 * (int)(local_39c / FVar21));
          p = pstd::pmr::polymorphic_allocator<std::byte>::
              new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (&alloc_local,renderFromLight,
                         L.
                         super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_39c,&alloc_local);
LAB_00355b59:
          uVar16 = (ulong)p | 0x7000000000000;
          (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits = uVar16;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
        }
        if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(portal.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)portal.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)portal.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(L.
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)L.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)L.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_00355c53;
      }
      local_1e0.bits =
           (outsideMedium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pGVar9 = GoniometricLight::Create
                         (renderFromLight,(MediumHandle *)&local_1e0,parameters,
                          parameters->colorSpace,loc,alloc);
      uVar16 = (ulong)pGVar9 | 0x4000000000000;
    }
LAB_00355c40:
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = uVar16;
  }
LAB_00355c53:
  if ((uVar16 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (LightHandle)
           (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            )this;
  }
  pcVar17 = "%s: unable to create light.";
LAB_00356210:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar17,name);
}

Assistant:

LightHandle LightHandle::Create(const std::string &name,
                                const ParameterDictionary &parameters,
                                const Transform &renderFromLight,
                                const CameraTransform &cameraTransform,
                                MediumHandle outsideMedium, const FileLoc *loc,
                                Allocator alloc) {
    LightHandle light = nullptr;
    if (name == "point")
        light = PointLight::Create(renderFromLight, outsideMedium, parameters,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spot")
        light = SpotLight::Create(renderFromLight, outsideMedium, parameters,
                                  parameters.ColorSpace(), loc, alloc);
    else if (name == "goniometric")
        light = GoniometricLight::Create(renderFromLight, outsideMedium, parameters,
                                         parameters.ColorSpace(), loc, alloc);
    else if (name == "projection")
        light = ProjectionLight::Create(renderFromLight, outsideMedium, parameters, loc,
                                        alloc);
    else if (name == "distant")
        light = DistantLight::Create(renderFromLight, parameters, parameters.ColorSpace(),
                                     loc, alloc);
    else if (name == "infinite") {
        const RGBColorSpace *colorSpace = parameters.ColorSpace();
        std::vector<SpectrumHandle> L =
            parameters.GetSpectrumArray("L", SpectrumType::Illuminant, alloc);
        Float scale = parameters.GetOneFloat("scale", 1);
        std::vector<Point3f> portal = parameters.GetPoint3fArray("portal");
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        Float E_v = parameters.GetOneFloat("illuminance", -1);

        if (L.empty() && filename.empty()) {
            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);
            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            // Default: color space's std illuminant
            light = alloc.new_object<UniformInfiniteLight>(
                renderFromLight, &colorSpace->illuminant, scale, alloc);
        } else if (!L.empty()) {
            if (!filename.empty())
                ErrorExit(loc, "Can't specify both emission \"L\" and "
                               "\"filename\" with ImageInfiniteLight");

            if (!portal.empty())
                ErrorExit(loc, "Portals are not supported for infinite lights "
                               "without \"filename\".");

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(L[0]);

            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            light = alloc.new_object<UniformInfiniteLight>(renderFromLight, L[0], scale,
                                                           alloc);
        } else {
            ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc);
            const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

            ImageChannelDesc channelDesc =
                imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
            if (!channelDesc)
                ErrorExit(loc,
                          "%s: image provided to \"infinite\" light must "
                          "have R, G, and B channels.",
                          filename);

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);

            if (E_v > 0) {
                // Upper hemisphere illuminance calculation for converting map to physical
                // units
                float illuminance = 0;
                const Image &image = imageAndMetadata.image;
                RGB lum = imageAndMetadata.metadata.GetColorSpace()->LuminanceVector();
                for (int y = 0; y < image.Resolution().y; ++y) {
                    float v = (float(y) + 0.5f) / float(image.Resolution().y);
                    for (int x = 0; x < image.Resolution().x; ++x) {
                        Float u = (x + 0.5f) / image.Resolution().x;
                        Vector3f w = EqualAreaSquareToSphere(Point2f(u, v));
                        // We could be more clever and see if we're in the inner rotated
                        // square, but not a big deal...
                        if (w.z <= 0)
                            continue;

                        ImageChannelValues values = image.GetChannels({x, y});
                        for (int c = 0; c < 3; ++c)
                            illuminance += values[c] * lum[c] * CosTheta(w);
                    }
                }
                illuminance *= 2 * Pi / (image.Resolution().x * image.Resolution().y);

                // scaling factor is just the ratio of the target
                // illuminance and the illuminance of the map multiplied by
                // the illuminant spectrum
                Float k_e = illuminance;
                scale *= E_v / k_e;
            }

            Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

            if (!portal.empty()) {
                for (Point3f &p : portal)
                    p = cameraTransform.RenderFromWorld(p);

                light = alloc.new_object<PortalImageInfiniteLight>(
                    renderFromLight, std::move(image), colorSpace, scale, filename,
                    portal, alloc);
            } else
                light = alloc.new_object<ImageInfiniteLight>(renderFromLight,
                                                             std::move(image), colorSpace,
                                                             scale, filename, alloc);
        }
    } else
        ErrorExit(loc, "%s: light type unknown.", name);

    if (!light)
        ErrorExit(loc, "%s: unable to create light.", name);

    parameters.ReportUnused();
    return light;
}